

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cirs2icrs.cpp
# Opt level: O3

void PrintResults(CESkyCoord *input,CESkyCoord *output,double jd)

{
  double dVar1;
  double dVar2;
  undefined4 uVar3;
  vector<double,_std::allocator<double>_> output_hms;
  vector<double,_std::allocator<double>_> input_hms;
  CEAngle aCStack_a8 [16];
  double local_98;
  CEDate local_90 [64];
  double *local_50 [3];
  double *local_38;
  
  local_98 = jd;
  CEDate::CEDate((CEDate *)0x4142b42c80000000,local_90,0);
  (**(code **)(*(long *)input + 0x18))(local_50,input,local_90);
  CEAngle::HmsVect();
  CEAngle::~CEAngle((CEAngle *)local_50);
  CEDate::~CEDate(local_90);
  CEDate::CEDate((CEDate *)0x4142b42c80000000,local_90,0);
  (**(code **)(*(long *)output + 0x18))(aCStack_a8,output,local_90);
  CEAngle::HmsVect();
  CEAngle::~CEAngle(aCStack_a8);
  CEDate::~CEDate(local_90);
  putchar(10);
  puts("**********************************************");
  puts("* Results of CIRS -> ICRS                    *");
  puts("**********************************************");
  puts("ICRS Coordinates (output)");
  printf("    Julian Date    : %f\n",local_98);
  dVar1 = *local_50[0];
  dVar2 = local_50[0][1];
  local_98 = local_50[0][2] + local_50[0][3];
  CEDate::CEDate((CEDate *)0x4142b42c80000000,local_90,0);
  (**(code **)(*(long *)output + 0x18))(aCStack_a8,output,local_90);
  uVar3 = CEAngle::Deg();
  printf("    Right Ascension: %02dh %02dm %04.1fs (%f deg)\n",local_98,uVar3,
         (ulong)(uint)(int)dVar1,(ulong)(uint)(int)dVar2);
  CEAngle::~CEAngle(aCStack_a8);
  CEDate::~CEDate(local_90);
  CEDate::CEDate((CEDate *)0x4142b42c80000000,local_90,0);
  (**(code **)(*(long *)output + 0x20))(aCStack_a8,output,local_90);
  CEAngle::Deg();
  printf("    Declination    : %+f degrees\n");
  CEAngle::~CEAngle(aCStack_a8);
  CEDate::~CEDate(local_90);
  puts("CIRS Coordinates (input)");
  dVar1 = *local_38;
  dVar2 = local_38[1];
  local_98 = local_38[2] + local_38[3];
  CEDate::CEDate((CEDate *)0x4142b42c80000000,local_90,0);
  (**(code **)(*(long *)input + 0x18))(aCStack_a8,input,local_90);
  uVar3 = CEAngle::Deg();
  printf("    Right Ascension: %02dh %02dm %04.1fs (%f deg)\n",local_98,uVar3,
         (ulong)(uint)(int)dVar1,(ulong)(uint)(int)dVar2);
  CEAngle::~CEAngle(aCStack_a8);
  CEDate::~CEDate(local_90);
  CEDate::CEDate((CEDate *)0x4142b42c80000000,local_90,0);
  (**(code **)(*(long *)input + 0x20))(aCStack_a8,input,local_90);
  CEAngle::Deg();
  printf("    Declination    : %+f degrees\n");
  CEAngle::~CEAngle(aCStack_a8);
  CEDate::~CEDate(local_90);
  putchar(10);
  if (local_50[0] != (double *)0x0) {
    operator_delete(local_50[0]);
  }
  if (local_38 != (double *)0x0) {
    operator_delete(local_38);
  }
  return;
}

Assistant:

void PrintResults(const  CESkyCoord& input,
                  const  CESkyCoord& output,
                  double jd)
{
    std::vector<double> input_hms = input.XCoord().HmsVect();
    std::vector<double> output_hms = output.XCoord().HmsVect();
    
    std::printf("\n") ;
    std::printf("**********************************************\n") ;
    std::printf("* Results of CIRS -> ICRS                    *\n") ;
    std::printf("**********************************************\n") ;
    std::printf("ICRS Coordinates (output)\n") ;
    std::printf("    Julian Date    : %f\n", jd) ;
    std::printf("    Right Ascension: %02dh %02dm %04.1fs (%f deg)\n",
                int(output_hms[0]), int(output_hms[1]), output_hms[2]+output_hms[3],
                output.XCoord().Deg()) ;
    std::printf("    Declination    : %+f degrees\n", output.YCoord().Deg()) ;
    std::printf("CIRS Coordinates (input)\n") ;
    std::printf("    Right Ascension: %02dh %02dm %04.1fs (%f deg)\n",
                int(input_hms[0]), int(input_hms[1]), input_hms[2]+input_hms[3],
                input.XCoord().Deg()) ;
    std::printf("    Declination    : %+f degrees\n", input.YCoord().Deg()) ;
    std::printf("\n") ;
}